

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcases.c
# Opt level: O1

int test_json2map_null(void)

{
  int iVar1;
  char *__s2;
  json2map_t *obj;
  int iVar2;
  
  __s2 = (char *)calloc(0x1fe,0xff);
  obj = json2map_init('\0');
  json2map_registerDataHook(obj,__s2,json2map_hookMethod);
  json2map_parse(obj,(char *)0x0,"{\"nullpointer\":null}");
  printf("Expected: \t%s\nActual: \t%s\n\n","nullpointer",__s2);
  iVar1 = strcmp("nullpointer",__s2);
  iVar2 = 1;
  if (iVar1 == 0) {
    printf("Expected: \t%s\nActual: \t%s\n\n","null",__s2 + 0xff);
    iVar1 = strcmp("null",__s2 + 0xff);
    if (iVar1 == 0) {
      json2map_destroy(obj);
      free(__s2);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int test_json2map_null() {
	keyvalue_t *map = (keyvalue_t *) calloc(sizeof(keyvalue_t), LIST_SIZE);

	json2map_t *json2mapObj = json2map_init(0);
	json2map_registerDataHook(json2mapObj, map, &json2map_hookMethod);
	json2map_parse(json2mapObj, NULL, "{\"nullpointer\":null}");

	ASSERTSTR("nullpointer", map[0].key);
	ASSERTSTR("null", map[0].value);

	json2map_destroy(json2mapObj);
	free(map);
	return 0;
}